

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

double __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::GetAVGSpeed
          (ChISO2631_Vibration_SeatCushionLogger *this)

{
  double dVar1;
  
  dVar1 = mean(&this->m_data_speed);
  return dVar1;
}

Assistant:

double ChISO2631_Vibration_SeatCushionLogger::GetAVGSpeed() const {
    return mean(m_data_speed);
}